

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int convertCompoundSelectToSubquery(Walker *pWalker,Select *p)

{
  Parse *pParse;
  sqlite3 *db;
  Expr **ppEVar1;
  ExprList_item *pEVar2;
  Select *pSVar3;
  SrcList *pSVar4;
  Expr *pExpr;
  ExprList *pEVar5;
  int iVar6;
  long lVar7;
  Select *pSVar8;
  Select *pSVar9;
  byte bVar10;
  Token dummy;
  
  bVar10 = 0;
  if (p->pPrior == (Select *)0x0) {
    return 0;
  }
  pEVar5 = p->pOrderBy;
  if (pEVar5 == (ExprList *)0x0) {
    return 0;
  }
  pSVar3 = p;
  while( true ) {
    if (pSVar3 == (Select *)0x0) {
      return 0;
    }
    if ((pSVar3->op != 0x83) && (pSVar3->op != 0x80)) break;
    pSVar3 = pSVar3->pPrior;
  }
  iVar6 = pEVar5->nExpr + 1;
  pEVar2 = pEVar5->a + ((ulong)(uint)pEVar5->nExpr - 1);
  do {
    iVar6 = iVar6 + -1;
    if (iVar6 < 1) {
      return 0;
    }
    ppEVar1 = &pEVar2->pExpr;
    pEVar2 = pEVar2 + -1;
  } while (((*ppEVar1)->flags & 0x100) == 0);
  pParse = pWalker->pParse;
  db = pParse->db;
  pSVar3 = (Select *)sqlite3DbMallocZero(db,0x80);
  iVar6 = 2;
  if (pSVar3 != (Select *)0x0) {
    dummy.z = (char *)0x0;
    dummy.n = 0;
    dummy._12_4_ = 0;
    pSVar4 = sqlite3SrcListAppendFromTerm
                       (pParse,(SrcList *)0x0,(Token *)0x0,(Token *)0x0,&dummy,pSVar3,(Expr *)0x0,
                        (IdList *)0x0);
    if (pSVar4 != (SrcList *)0x0) {
      pSVar8 = p;
      pSVar9 = pSVar3;
      for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
        pSVar9->pEList = pSVar8->pEList;
        pSVar8 = (Select *)((long)pSVar8 + (ulong)bVar10 * -0x10 + 8);
        pSVar9 = (Select *)((long)pSVar9 + (ulong)bVar10 * -0x10 + 8);
      }
      p->pSrc = pSVar4;
      pExpr = sqlite3Expr(db,0xac,(char *)0x0);
      pEVar5 = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pExpr);
      p->pEList = pEVar5;
      p->op = 0x83;
      p->pWhere = (Expr *)0x0;
      pSVar3->pOrderBy = (ExprList *)0x0;
      pSVar3->pGroupBy = (ExprList *)0x0;
      pSVar3->pHaving = (Expr *)0x0;
      p->pWith = (With *)0x0;
      p->pPrior = (Select *)0x0;
      p->pNext = (Select *)0x0;
      p->selFlags = p->selFlags & 0xfffefeff | 0x10000;
      pSVar3->pPrior->pNext = pSVar3;
      pSVar3->pLimit = (Expr *)0x0;
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

static int convertCompoundSelectToSubquery(Walker *pWalker, Select *p){
  int i;
  Select *pNew;
  Select *pX;
  sqlite3 *db;
  struct ExprList_item *a;
  SrcList *pNewSrc;
  Parse *pParse;
  Token dummy;

  if( p->pPrior==0 ) return WRC_Continue;
  if( p->pOrderBy==0 ) return WRC_Continue;
  for(pX=p; pX && (pX->op==TK_ALL || pX->op==TK_SELECT); pX=pX->pPrior){}
  if( pX==0 ) return WRC_Continue;
  a = p->pOrderBy->a;
  for(i=p->pOrderBy->nExpr-1; i>=0; i--){
    if( a[i].pExpr->flags & EP_Collate ) break;
  }
  if( i<0 ) return WRC_Continue;

  /* If we reach this point, that means the transformation is required. */

  pParse = pWalker->pParse;
  db = pParse->db;
  pNew = sqlite3DbMallocZero(db, sizeof(*pNew) );
  if( pNew==0 ) return WRC_Abort;
  memset(&dummy, 0, sizeof(dummy));
  pNewSrc = sqlite3SrcListAppendFromTerm(pParse,0,0,0,&dummy,pNew,0,0);
  if( pNewSrc==0 ) return WRC_Abort;
  *pNew = *p;
  p->pSrc = pNewSrc;
  p->pEList = sqlite3ExprListAppend(pParse, 0, sqlite3Expr(db, TK_ASTERISK, 0));
  p->op = TK_SELECT;
  p->pWhere = 0;
  pNew->pGroupBy = 0;
  pNew->pHaving = 0;
  pNew->pOrderBy = 0;
  p->pPrior = 0;
  p->pNext = 0;
  p->pWith = 0;
  p->selFlags &= ~SF_Compound;
  assert( (p->selFlags & SF_Converted)==0 );
  p->selFlags |= SF_Converted;
  assert( pNew->pPrior!=0 );
  pNew->pPrior->pNext = pNew;
  pNew->pLimit = 0;
  return WRC_Continue;
}